

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

void __thiscall Flasher::erase(Flasher *this,uint32_t foffset)

{
  pointer pFVar1;
  uint32_t foffset_local;
  Flasher *this_local;
  
  (*this->_observer->_vptr_FlasherObserver[2])(this->_observer,"Erase flash\n");
  pFVar1 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  (*pFVar1->_vptr_Flash[8])(pFVar1,(ulong)foffset);
  pFVar1 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
  (*pFVar1->_vptr_Flash[9])(pFVar1,0);
  return;
}

Assistant:

void
Flasher::erase(uint32_t foffset)
{
    _observer.onStatus("Erase flash\n");
    _flash->eraseAll(foffset);
    _flash->eraseAuto(false);
}